

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-solver.cc
# Opt level: O3

string * __thiscall
mp::NLModel::WriteNL
          (string *__return_storage_ptr__,NLModel *this,string *fln,NLW2_NLOptionsBasic_C opts,
          NLUtils *ut,PreprocessData *pd)

{
  NLFeeder_Easy nlf;
  WriteNLResult WStack_318;
  NLFeeder_Easy local_2f0;
  
  NLFeeder_Easy::NLFeeder_Easy(&local_2f0,this,opts);
  NLFeeder_Easy::ExportPreproData(&local_2f0,pd);
  WriteNLFile<mp::NLFeeder_Easy>(&WStack_318,fln,&local_2f0,ut);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)WStack_318.second._M_dataplus._M_p == &WStack_318.second.field_2) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         WStack_318.second.field_2._M_allocated_capacity;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = WStack_318.second.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = WStack_318.second._M_dataplus._M_p;
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         WStack_318.second.field_2._M_allocated_capacity;
  }
  __return_storage_ptr__->_M_string_length = WStack_318.second._M_string_length;
  if (local_2f0.col_sizes_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2f0.col_sizes_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2f0.col_sizes_.super__Vector_base<int,_std::allocator<int>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage -
                    (long)local_2f0.col_sizes_.super__Vector_base<int,_std::allocator<int>_>._M_impl
                          .super__Vector_impl_data._M_start);
  }
  if (local_2f0.obj_grad_supp_.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_2f0.obj_grad_supp_.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_2f0.obj_grad_supp_.super__Bvector_base<std::allocator<bool>_>.
                          _M_impl.super__Bvector_impl_data._M_end_of_storage -
                    (long)local_2f0.obj_grad_supp_.super__Bvector_base<std::allocator<bool>_>.
                          _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_2f0.obj_grad_supp_.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_2f0.obj_grad_supp_.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
    local_2f0.obj_grad_supp_.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_2f0.obj_grad_supp_.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
    local_2f0.obj_grad_supp_.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  }
  if (local_2f0.var_perm_.
      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2f0.var_perm_.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_2f0.var_perm_.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2f0.var_perm_.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2f0.nlv_obj_.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
      ._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_2f0.nlv_obj_.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_2f0.nlv_obj_.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_2f0.nlv_obj_.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_2f0.nlv_obj_.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_2f0.nlv_obj_.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_start.super__Bit_iterator_base._M_offset = 0;
    local_2f0.nlv_obj_.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_2f0.nlv_obj_.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_finish.super__Bit_iterator_base._M_offset = 0;
    local_2f0.nlv_obj_.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  std::
  _Rb_tree<mp::NLSuffix,_mp::NLSuffix,_std::_Identity<mp::NLSuffix>,_std::less<mp::NLSuffix>,_std::allocator<mp::NLSuffix>_>
  ::~_Rb_tree((_Rb_tree<mp::NLSuffix,_mp::NLSuffix,_std::_Identity<mp::NLSuffix>,_std::less<mp::NLSuffix>,_std::allocator<mp::NLSuffix>_>
               *)&local_2f0.nlme_.suffixes_);
  return __return_storage_ptr__;
}

Assistant:

std::string NLModel::WriteNL(
    const std::string &fln, NLW2_NLOptionsBasic_C opts,
    NLUtils &ut, PreprocessData &pd) {
  NLFeeder_Easy nlf(*this, opts);
  nlf.ExportPreproData(pd);
  return WriteNLFile(fln, nlf, ut).second;
}